

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

string * __thiscall
phosg::Image::save_abi_cxx11_(string *__return_storage_ptr__,Image *this,Format format)

{
  anon_class_8_1_6971b95b local_28;
  undefined1 local_1d;
  Format local_1c;
  Image *pIStack_18;
  Format format_local;
  Image *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = format;
  pIStack_18 = this;
  this_local = (Image *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28.result = __return_storage_ptr__;
  save_helper<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0>
            (this,local_1c,&local_28);
  return __return_storage_ptr__;
}

Assistant:

string Image::save(Format format) const {
  string result;
  this->save_helper(format, [&result](const void* data, size_t size) {
    result.append(reinterpret_cast<const char*>(data), size);
  });
  return result;
}